

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::LatchVisitor::check_stmt_block(StmtBlock *stmt,Var *var,bool full_branch)

{
  bool bVar1;
  anon_class_8_1_ba1d8287 local_48;
  function<bool_(kratos::Stmt_*)> local_40;
  byte local_19;
  Var *pVStack_18;
  bool full_branch_local;
  Var *var_local;
  StmtBlock *stmt_local;
  
  local_48.var = var;
  local_19 = full_branch;
  pVStack_18 = var;
  var_local = (Var *)stmt;
  std::function<bool(kratos::Stmt*)>::
  function<kratos::LatchVisitor::check_stmt_block(kratos::StmtBlock*,kratos::Var*,bool)::_lambda(kratos::Stmt*)_1_,void>
            ((function<bool(kratos::Stmt*)> *)&local_40,&local_48);
  bVar1 = check_stmt_condition(&stmt->super_Stmt,&local_40,false,(bool)(local_19 & 1));
  std::function<bool_(kratos::Stmt_*)>::~function(&local_40);
  return bVar1;
}

Assistant:

bool static check_stmt_block(StmtBlock* stmt, Var* var, bool full_branch) {
        return check_stmt_condition(
            stmt,
            [=](Stmt* s) -> bool {
                if (s->type() == StatementType::Assign) {
                    auto assign = s->as<AssignStmt>();
                    return assign->left() == var;
                }
                return false;
            },
            false, full_branch);
    }